

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O1

Mat * ncnn::Mat::from_pixels
                (Mat *__return_storage_ptr__,uchar *pixels,int type,int w,int h,int stride,
                Allocator *allocator)

{
  byte bVar1;
  void *pvVar2;
  int *piVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  float *pfVar8;
  long lVar9;
  float *pfVar10;
  ulong uVar11;
  long lVar12;
  float *pfVar13;
  float *pfVar14;
  int iVar15;
  byte *pbVar16;
  int iVar17;
  int iVar20;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar25;
  undefined1 auVar24 [16];
  Mat local_78;
  
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->refcount + 4) = (undefined1  [16])0x0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->c = 0;
  __return_storage_ptr__->cstep = 0;
  if ((uint)type < 0x10000) {
    if (type - 1U < 2) {
      from_rgb(pixels,w,h,stride,__return_storage_ptr__,allocator);
    }
    if ((short)type != 4) {
      if ((type & 0xffffU) != 3) {
        return __return_storage_ptr__;
      }
      create(__return_storage_ptr__,w,h,1,4,allocator);
      pfVar8 = (float *)__return_storage_ptr__->data;
      if ((pfVar8 != (float *)0x0) &&
         ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep != 0)) {
        iVar25 = 1;
        iVar20 = h;
        if (stride - w == 0) {
          iVar25 = h;
          iVar20 = 1;
        }
        if (0 < iVar20) {
          iVar15 = 0;
          pbVar16 = pixels;
          do {
            iVar17 = iVar25 * w + 1;
            if (0 < iVar25 * w) {
              do {
                *pfVar8 = (float)*pbVar16;
                pbVar16 = pbVar16 + 1;
                pfVar8 = pfVar8 + 1;
                iVar17 = iVar17 + -1;
              } while (1 < iVar17);
            }
            pbVar16 = pbVar16 + (stride - w);
            iVar15 = iVar15 + 1;
          } while (iVar15 != iVar20);
        }
      }
      if (type != 4) {
        return __return_storage_ptr__;
      }
    }
    create(__return_storage_ptr__,w,h,4,4,allocator);
    pfVar8 = (float *)__return_storage_ptr__->data;
    if (pfVar8 == (float *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar20 = stride + w * -4;
    iVar25 = 1;
    if (iVar20 == 0) {
      iVar25 = h;
      h = 1;
    }
    if (h < 1) {
      return __return_storage_ptr__;
    }
    lVar9 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
    pfVar13 = (float *)(lVar9 * 3 + (long)pfVar8);
    pfVar14 = (float *)((long)pfVar8 + lVar9 * 2);
    pfVar10 = (float *)(lVar9 + (long)pfVar8);
    iVar15 = 0;
    do {
      iVar17 = iVar25 * w + 1;
      if (0 < iVar25 * w) {
        do {
          *pfVar8 = (float)*pixels;
          *pfVar10 = (float)pixels[1];
          *pfVar14 = (float)pixels[2];
          *pfVar13 = (float)pixels[3];
          pixels = pixels + 4;
          pfVar8 = pfVar8 + 1;
          pfVar10 = pfVar10 + 1;
          pfVar14 = pfVar14 + 1;
          pfVar13 = pfVar13 + 1;
          iVar17 = iVar17 + -1;
        } while (1 < iVar17);
      }
      pixels = pixels + iVar20;
      iVar15 = iVar15 + 1;
    } while (iVar15 != h);
    return __return_storage_ptr__;
  }
  if (0x30000 < type) {
    if (0x40000 < type) {
      if (type == 0x40001) {
        create(__return_storage_ptr__,w,h,4,4,allocator);
        local_78.data = __return_storage_ptr__->data;
        if (local_78.data == (void *)0x0) {
          return __return_storage_ptr__;
        }
        if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
          return __return_storage_ptr__;
        }
        local_78.elemsize = __return_storage_ptr__->elemsize;
        local_78.elempack = __return_storage_ptr__->elempack;
        local_78.allocator = __return_storage_ptr__->allocator;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.w = __return_storage_ptr__->w;
        local_78.dims = 3;
        local_78.h = __return_storage_ptr__->h;
        local_78.c = 3;
        local_78.cstep =
             ((long)(__return_storage_ptr__->h * __return_storage_ptr__->w) * local_78.elemsize +
              0xf & 0xfffffffffffffff0) / local_78.elemsize;
        from_rgb(pixels,w,h,stride,&local_78,allocator);
        auVar6 = _DAT_0017b060;
        auVar5 = _DAT_0017b050;
        auVar4 = _DAT_0017b040;
        uVar7 = __return_storage_ptr__->h * __return_storage_ptr__->w;
        if (0 < (int)uVar7) {
          pvVar2 = __return_storage_ptr__->data;
          lVar9 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
          lVar12 = (ulong)uVar7 - 1;
          auVar24._8_4_ = (int)lVar12;
          auVar24._0_8_ = lVar12;
          auVar24._12_4_ = (int)((ulong)lVar12 >> 0x20);
          uVar11 = 0;
          auVar24 = auVar24 ^ _DAT_0017b060;
          do {
            auVar22._8_4_ = (int)uVar11;
            auVar22._0_8_ = uVar11;
            auVar22._12_4_ = (int)(uVar11 >> 0x20);
            auVar19 = (auVar22 | auVar5) ^ auVar6;
            iVar20 = auVar24._4_4_;
            if ((bool)(~(auVar19._4_4_ == iVar20 && auVar24._0_4_ < auVar19._0_4_ ||
                        iVar20 < auVar19._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar2 + uVar11 * 4 + lVar9 * 3) = 0x437f0000;
            }
            if ((auVar19._12_4_ != auVar24._12_4_ || auVar19._8_4_ <= auVar24._8_4_) &&
                auVar19._12_4_ <= auVar24._12_4_) {
              *(undefined4 *)((long)pvVar2 + uVar11 * 4 + lVar9 * 3 + 4) = 0x437f0000;
            }
            auVar22 = (auVar22 | auVar4) ^ auVar6;
            iVar25 = auVar22._4_4_;
            if (iVar25 <= iVar20 && (iVar25 != iVar20 || auVar22._0_4_ <= auVar24._0_4_)) {
              *(undefined4 *)((long)pvVar2 + uVar11 * 4 + lVar9 * 3 + 8) = 0x437f0000;
              *(undefined4 *)((long)pvVar2 + uVar11 * 4 + lVar9 * 3 + 0xc) = 0x437f0000;
            }
            uVar11 = uVar11 + 4;
          } while ((uVar7 + 3 & 0xfffffffc) != uVar11);
        }
        piVar3 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        if (piVar3 == (int *)0x0) {
          return __return_storage_ptr__;
        }
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 != 0) {
          return __return_storage_ptr__;
        }
        if (local_78.allocator != (Allocator *)0x0) {
          (*(local_78.allocator)->_vptr_Allocator[3])();
          return __return_storage_ptr__;
        }
      }
      else if (type == 0x40002) {
        create(__return_storage_ptr__,w,h,4,4,allocator);
        local_78.data = __return_storage_ptr__->data;
        if (local_78.data == (void *)0x0) {
          return __return_storage_ptr__;
        }
        if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
          return __return_storage_ptr__;
        }
        local_78.elemsize = __return_storage_ptr__->elemsize;
        local_78.elempack = __return_storage_ptr__->elempack;
        local_78.allocator = __return_storage_ptr__->allocator;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.w = __return_storage_ptr__->w;
        local_78.dims = 3;
        local_78.h = __return_storage_ptr__->h;
        local_78.c = 3;
        local_78.cstep =
             ((long)(__return_storage_ptr__->h * __return_storage_ptr__->w) * local_78.elemsize +
              0xf & 0xfffffffffffffff0) / local_78.elemsize;
        from_rgb2bgr(pixels,w,h,stride,&local_78,allocator);
        auVar6 = _DAT_0017b060;
        auVar5 = _DAT_0017b050;
        auVar4 = _DAT_0017b040;
        uVar7 = __return_storage_ptr__->h * __return_storage_ptr__->w;
        if (0 < (int)uVar7) {
          pvVar2 = __return_storage_ptr__->data;
          lVar9 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
          lVar12 = (ulong)uVar7 - 1;
          auVar19._8_4_ = (int)lVar12;
          auVar19._0_8_ = lVar12;
          auVar19._12_4_ = (int)((ulong)lVar12 >> 0x20);
          uVar11 = 0;
          auVar19 = auVar19 ^ _DAT_0017b060;
          do {
            auVar23._8_4_ = (int)uVar11;
            auVar23._0_8_ = uVar11;
            auVar23._12_4_ = (int)(uVar11 >> 0x20);
            auVar24 = (auVar23 | auVar5) ^ auVar6;
            iVar20 = auVar19._4_4_;
            if ((bool)(~(auVar24._4_4_ == iVar20 && auVar19._0_4_ < auVar24._0_4_ ||
                        iVar20 < auVar24._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar2 + uVar11 * 4 + lVar9 * 3) = 0x437f0000;
            }
            if ((auVar24._12_4_ != auVar19._12_4_ || auVar24._8_4_ <= auVar19._8_4_) &&
                auVar24._12_4_ <= auVar19._12_4_) {
              *(undefined4 *)((long)pvVar2 + uVar11 * 4 + lVar9 * 3 + 4) = 0x437f0000;
            }
            auVar24 = (auVar23 | auVar4) ^ auVar6;
            iVar25 = auVar24._4_4_;
            if (iVar25 <= iVar20 && (iVar25 != iVar20 || auVar24._0_4_ <= auVar19._0_4_)) {
              *(undefined4 *)((long)pvVar2 + uVar11 * 4 + lVar9 * 3 + 8) = 0x437f0000;
              *(undefined4 *)((long)pvVar2 + uVar11 * 4 + lVar9 * 3 + 0xc) = 0x437f0000;
            }
            uVar11 = uVar11 + 4;
          } while ((uVar7 + 3 & 0xfffffffc) != uVar11);
        }
        piVar3 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        if (piVar3 == (int *)0x0) {
          return __return_storage_ptr__;
        }
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 != 0) {
          return __return_storage_ptr__;
        }
        if (local_78.allocator != (Allocator *)0x0) {
          (*(local_78.allocator)->_vptr_Allocator[3])();
          return __return_storage_ptr__;
        }
      }
      else {
        if (type != 0x40003) {
          return __return_storage_ptr__;
        }
        create(__return_storage_ptr__,w,h,4,4,allocator);
        local_78.data = __return_storage_ptr__->data;
        if (local_78.data == (void *)0x0) {
          return __return_storage_ptr__;
        }
        if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
          return __return_storage_ptr__;
        }
        local_78.elemsize = __return_storage_ptr__->elemsize;
        local_78.elempack = __return_storage_ptr__->elempack;
        local_78.allocator = __return_storage_ptr__->allocator;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.w = __return_storage_ptr__->w;
        local_78.dims = 3;
        local_78.h = __return_storage_ptr__->h;
        local_78.c = 3;
        local_78.cstep =
             ((long)(__return_storage_ptr__->h * __return_storage_ptr__->w) * local_78.elemsize +
              0xf & 0xfffffffffffffff0) / local_78.elemsize;
        from_gray2rgb(pixels,w,h,stride,&local_78,allocator);
        auVar6 = _DAT_0017b060;
        auVar5 = _DAT_0017b050;
        auVar4 = _DAT_0017b040;
        uVar7 = __return_storage_ptr__->h * __return_storage_ptr__->w;
        if (0 < (int)uVar7) {
          pvVar2 = __return_storage_ptr__->data;
          lVar9 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
          lVar12 = (ulong)uVar7 - 1;
          auVar18._8_4_ = (int)lVar12;
          auVar18._0_8_ = lVar12;
          auVar18._12_4_ = (int)((ulong)lVar12 >> 0x20);
          uVar11 = 0;
          auVar18 = auVar18 ^ _DAT_0017b060;
          do {
            auVar21._8_4_ = (int)uVar11;
            auVar21._0_8_ = uVar11;
            auVar21._12_4_ = (int)(uVar11 >> 0x20);
            auVar24 = (auVar21 | auVar5) ^ auVar6;
            iVar20 = auVar18._4_4_;
            if ((bool)(~(auVar24._4_4_ == iVar20 && auVar18._0_4_ < auVar24._0_4_ ||
                        iVar20 < auVar24._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar2 + uVar11 * 4 + lVar9 * 3) = 0x437f0000;
            }
            if ((auVar24._12_4_ != auVar18._12_4_ || auVar24._8_4_ <= auVar18._8_4_) &&
                auVar24._12_4_ <= auVar18._12_4_) {
              *(undefined4 *)((long)pvVar2 + uVar11 * 4 + lVar9 * 3 + 4) = 0x437f0000;
            }
            auVar24 = (auVar21 | auVar4) ^ auVar6;
            iVar25 = auVar24._4_4_;
            if (iVar25 <= iVar20 && (iVar25 != iVar20 || auVar24._0_4_ <= auVar18._0_4_)) {
              *(undefined4 *)((long)pvVar2 + uVar11 * 4 + lVar9 * 3 + 8) = 0x437f0000;
              *(undefined4 *)((long)pvVar2 + uVar11 * 4 + lVar9 * 3 + 0xc) = 0x437f0000;
            }
            uVar11 = uVar11 + 4;
          } while ((uVar7 + 3 & 0xfffffffc) != uVar11);
        }
        piVar3 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        if (piVar3 == (int *)0x0) {
          return __return_storage_ptr__;
        }
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 != 0) {
          return __return_storage_ptr__;
        }
        if (local_78.allocator != (Allocator *)0x0) {
          (*(local_78.allocator)->_vptr_Allocator[3])();
          return __return_storage_ptr__;
        }
      }
      if (local_78.data == (void *)0x0) {
        return __return_storage_ptr__;
      }
      free(local_78.data);
      return __return_storage_ptr__;
    }
    if (type == 0x30001) {
      create(__return_storage_ptr__,w,h,1,4,allocator);
      pfVar8 = (float *)__return_storage_ptr__->data;
      if (pfVar8 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar20 = stride + w * -3;
      iVar25 = 1;
      if (iVar20 == 0) {
        iVar25 = h;
        h = 1;
      }
      if (h < 1) {
        return __return_storage_ptr__;
      }
      iVar15 = 0;
      do {
        iVar17 = iVar25 * w + 1;
        if (0 < iVar25 * w) {
          do {
            bVar1 = pixels[2];
            *pfVar8 = (float)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                              (uint)pixels[1] * 0x96 + (uint)*pixels * 0x4d >> 8);
            pixels = pixels + 3;
            pfVar8 = pfVar8 + 1;
            iVar17 = iVar17 + -1;
          } while (1 < iVar17);
        }
        pixels = pixels + iVar20;
        iVar15 = iVar15 + 1;
      } while (iVar15 != h);
      return __return_storage_ptr__;
    }
    if (type == 0x30002) {
      create(__return_storage_ptr__,w,h,1,4,allocator);
      pfVar8 = (float *)__return_storage_ptr__->data;
      if (pfVar8 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar20 = stride + w * -3;
      iVar25 = 1;
      if (iVar20 == 0) {
        iVar25 = h;
        h = 1;
      }
      if (h < 1) {
        return __return_storage_ptr__;
      }
      iVar15 = 0;
      do {
        iVar17 = iVar25 * w + 1;
        if (0 < iVar25 * w) {
          do {
            bVar1 = *pixels;
            *pfVar8 = (float)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                              (uint)pixels[1] * 0x96 + (uint)pixels[2] * 0x4d >> 8);
            pixels = pixels + 3;
            pfVar8 = pfVar8 + 1;
            iVar17 = iVar17 + -1;
          } while (1 < iVar17);
        }
        pixels = pixels + iVar20;
        iVar15 = iVar15 + 1;
      } while (iVar15 != h);
      return __return_storage_ptr__;
    }
    if (type != 0x30004) {
      return __return_storage_ptr__;
    }
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar8 = (float *)__return_storage_ptr__->data;
    if (pfVar8 == (float *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar20 = stride + w * -4;
    iVar25 = 1;
    if (iVar20 == 0) {
      iVar25 = h;
      h = 1;
    }
    if (h < 1) {
      return __return_storage_ptr__;
    }
    iVar15 = 0;
    do {
      iVar17 = iVar25 * w + 1;
      if (0 < iVar25 * w) {
        do {
          bVar1 = pixels[2];
          *pfVar8 = (float)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                            (uint)pixels[1] * 0x96 + (uint)*pixels * 0x4d >> 8);
          pixels = pixels + 4;
          pfVar8 = pfVar8 + 1;
          iVar17 = iVar17 + -1;
        } while (1 < iVar17);
      }
      pixels = pixels + iVar20;
      iVar15 = iVar15 + 1;
    } while (iVar15 != h);
    return __return_storage_ptr__;
  }
  if (type < 0x20001) {
    if (type == 0x10002) {
LAB_0011ae19:
      from_rgb2bgr(pixels,w,h,stride,__return_storage_ptr__,allocator);
      return __return_storage_ptr__;
    }
    if (type != 0x10003) {
      if (type != 0x10004) {
        return __return_storage_ptr__;
      }
      create(__return_storage_ptr__,w,h,3,4,allocator);
      pfVar8 = (float *)__return_storage_ptr__->data;
      if (pfVar8 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar20 = stride + w * -4;
      iVar25 = 1;
      if (iVar20 == 0) {
        iVar25 = h;
        h = 1;
      }
      if (h < 1) {
        return __return_storage_ptr__;
      }
      lVar9 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
      pfVar14 = (float *)((long)pfVar8 + lVar9 * 2);
      pfVar10 = (float *)(lVar9 + (long)pfVar8);
      iVar15 = 0;
      do {
        iVar17 = iVar25 * w + 1;
        if (0 < iVar25 * w) {
          do {
            *pfVar8 = (float)*pixels;
            *pfVar10 = (float)pixels[1];
            *pfVar14 = (float)pixels[2];
            pixels = pixels + 4;
            pfVar8 = pfVar8 + 1;
            pfVar10 = pfVar10 + 1;
            pfVar14 = pfVar14 + 1;
            iVar17 = iVar17 + -1;
          } while (1 < iVar17);
        }
        pixels = pixels + iVar20;
        iVar15 = iVar15 + 1;
      } while (iVar15 != h);
      return __return_storage_ptr__;
    }
  }
  else {
    if (type == 0x20001) goto LAB_0011ae19;
    if (type != 0x20003) {
      if (type != 0x20004) {
        return __return_storage_ptr__;
      }
      create(__return_storage_ptr__,w,h,3,4,allocator);
      pfVar8 = (float *)__return_storage_ptr__->data;
      if (pfVar8 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar20 = stride + w * -4;
      iVar25 = 1;
      if (iVar20 == 0) {
        iVar25 = h;
        h = 1;
      }
      if (h < 1) {
        return __return_storage_ptr__;
      }
      lVar9 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
      pfVar14 = (float *)((long)pfVar8 + lVar9 * 2);
      pfVar10 = (float *)(lVar9 + (long)pfVar8);
      iVar15 = 0;
      do {
        iVar17 = iVar25 * w + 1;
        if (0 < iVar25 * w) {
          do {
            *pfVar8 = (float)pixels[2];
            *pfVar10 = (float)pixels[1];
            *pfVar14 = (float)*pixels;
            pixels = pixels + 4;
            pfVar8 = pfVar8 + 1;
            pfVar10 = pfVar10 + 1;
            pfVar14 = pfVar14 + 1;
            iVar17 = iVar17 + -1;
          } while (1 < iVar17);
        }
        pixels = pixels + iVar20;
        iVar15 = iVar15 + 1;
      } while (iVar15 != h);
      return __return_storage_ptr__;
    }
  }
  from_gray2rgb(pixels,w,h,stride,__return_storage_ptr__,allocator);
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::from_pixels(const unsigned char* pixels, int type, int w, int h, int stride, Allocator* allocator)
{
    Mat m;

    if (type & PIXEL_CONVERT_MASK)
    {
        switch (type)
        {
        case PIXEL_RGB2BGR:
        case PIXEL_BGR2RGB:
            from_rgb2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2GRAY:
            from_rgb2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2RGBA:
            from_rgb2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2GRAY:
            from_bgr2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2RGBA:
            from_bgr2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGB:
        case PIXEL_GRAY2BGR:
            from_gray2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGBA:
            from_gray2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2RGB:
            from_rgba2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2BGR:
            from_rgba2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2GRAY:
            from_rgba2gray(pixels, w, h, stride, m, allocator);
            break;
        default:
            // unimplemented convert type
            break;
        }
    }
    else
    {
        if (type == PIXEL_RGB || type == PIXEL_BGR)
            from_rgb(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_GRAY)
            from_gray(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_RGBA)
            from_rgba(pixels, w, h, stride, m, allocator);
    }

    return m;
}